

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmPostModify(LlvmCompilationContext *ctx,ExprPostModify *node)

{
  TypeBase *pTVar1;
  LLVMValueRef pLVar2;
  TypeBase *type;
  
  CompileLlvm(ctx,node->value);
  pTVar1 = node->value->type;
  if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0x12)) {
    pLVar2 = ConvertToStackType(ctx,(LLVMValueRef)&placeholderValue,
                                (TypeBase *)pTVar1[1]._vptr_TypeBase);
    type = GetStackType(ctx,(TypeBase *)pTVar1[1]._vptr_TypeBase);
    ExpressionContext::IsIntegerType(ctx->ctx,type);
    CompileLlvmType(ctx,type);
    ConvertToDataType(ctx,(LLVMValueRef)&placeholderValue,type,(TypeBase *)pTVar1[1]._vptr_TypeBase)
    ;
    pLVar2 = CheckType(ctx,&node->super_ExprBase,pLVar2);
    return pLVar2;
  }
  __assert_fail("refType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x32f,
                "LLVMValueRef CompileLlvmPostModify(LlvmCompilationContext &, ExprPostModify *)");
}

Assistant:

LLVMValueRef CompileLlvmPostModify(LlvmCompilationContext &ctx, ExprPostModify *node)
{
	LLVMValueRef address = CompileLlvm(ctx, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	LLVMValueRef value = ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, address, ""), refType->subType);
	LLVMValueRef result = value;

	TypeBase *stackType = GetStackType(ctx, refType->subType);

	if(ctx.ctx.IsIntegerType(stackType))
		value = LLVMBuildAdd(ctx.builder, value, LLVMConstInt(CompileLlvmType(ctx, stackType), node->isIncrement ? 1 : -1, true), "");
	else
		value = LLVMBuildFAdd(ctx.builder, value, LLVMConstReal(CompileLlvmType(ctx, stackType), node->isIncrement ? 1.0 : -1.0), "");

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, value, stackType, refType->subType), address);

	return CheckType(ctx, node, result);
}